

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

void __thiscall gl4cts::ShaderSubroutine::FunctionalTest18_19::initTest(FunctionalTest18_19 *this)

{
  GLuint *pGVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  bool bVar13;
  int iVar14;
  GLuint GVar15;
  GLenum GVar16;
  undefined4 extraout_EAX;
  GLint GVar17;
  undefined4 extraout_EAX_00;
  undefined4 extraout_var;
  TestError *this_00;
  FunctionalTest18_19 *in_RSI;
  allocator<char> local_d0;
  allocator<char> local_cf;
  allocator<char> local_ce;
  allocator<char> local_cd;
  uint n_varyings;
  char *varyings [1];
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string vs_body;
  Functions *gl;
  
  iVar14 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar14);
  varyings[0] = "result";
  getVertexShaderBody_abi_cxx11_(&vs_body,in_RSI);
  n_varyings = 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,glcts::fixed_sample_locations_values + 1,&local_cd);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,glcts::fixed_sample_locations_values + 1,&local_ce);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,glcts::fixed_sample_locations_values + 1,&local_cf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,glcts::fixed_sample_locations_values + 1,&local_d0);
  pGVar1 = &this->m_po_id;
  bVar13 = Utils::buildProgram(gl,&vs_body,&local_60,&local_80,&local_a0,&local_c0,varyings,
                               &n_varyings,&this->m_vs_id,(GLuint *)0x0,(GLuint *)0x0,(GLuint *)0x0,
                               (GLuint *)0x0,pGVar1);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  if (bVar13) {
    GVar15 = (*gl->getSubroutineIndex)(*pGVar1,0x8b31,"divideByTwo");
    this->m_po_subroutine_divide_by_two_location = GVar15;
    GVar15 = (*gl->getSubroutineIndex)(this->m_po_id,0x8b31,"multiplyByFour");
    this->m_po_subroutine_multiply_by_four_location = GVar15;
    GVar15 = (*gl->getSubroutineIndex)(this->m_po_id,0x8b31,"returnsFalse");
    this->m_po_subroutine_returns_false_location = GVar15;
    GVar15 = (*gl->getSubroutineIndex)(this->m_po_id,0x8b31,"returnsTrue");
    this->m_po_subroutine_returns_true_location = GVar15;
    GVar16 = (*gl->getError)();
    glu::checkError(GVar16,"glGetSubroutineIndex() call(s) failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x257f);
    uVar2 = this->m_po_subroutine_divide_by_two_location;
    uVar4 = this->m_po_subroutine_multiply_by_four_location;
    uVar6 = this->m_po_subroutine_returns_false_location;
    uVar8 = this->m_po_subroutine_returns_true_location;
    auVar11._4_4_ = -(uint)(uVar4 == -1);
    auVar11._0_4_ = -(uint)(uVar2 == -1);
    auVar11._8_4_ = -(uint)(uVar6 == -1);
    auVar11._12_4_ = -(uint)(uVar8 == -1);
    iVar14 = movmskps(extraout_EAX,auVar11);
    if (iVar14 == 0) {
      GVar17 = (*gl->getSubroutineUniformLocation)(*pGVar1,0x8b31,"bool_operator1");
      this->m_po_subroutine_uniform_bool_operator1 = GVar17;
      GVar17 = (*gl->getSubroutineUniformLocation)(this->m_po_id,0x8b31,"bool_operator2");
      this->m_po_subroutine_uniform_bool_operator2 = GVar17;
      GVar17 = (*gl->getSubroutineUniformLocation)(this->m_po_id,0x8b31,"vec4_operator1");
      this->m_po_subroutine_uniform_vec4_processor1 = GVar17;
      GVar17 = (*gl->getSubroutineUniformLocation)(this->m_po_id,0x8b31,"vec4_operator2");
      this->m_po_subroutine_uniform_vec4_processor2 = GVar17;
      GVar16 = (*gl->getError)();
      glu::checkError(GVar16,"glGetSubroutineUniformLocation() call(s) failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x2591);
      uVar3 = this->m_po_subroutine_uniform_bool_operator1;
      uVar5 = this->m_po_subroutine_uniform_bool_operator2;
      uVar7 = this->m_po_subroutine_uniform_vec4_processor1;
      uVar9 = this->m_po_subroutine_uniform_vec4_processor2;
      auVar12._4_4_ = -(uint)(uVar5 == -1);
      auVar12._0_4_ = -(uint)(uVar3 == -1);
      auVar12._8_4_ = -(uint)(uVar7 == -1);
      auVar12._12_4_ = -(uint)(uVar9 == -1);
      iVar14 = movmskps(extraout_EAX_00,auVar12);
      if (iVar14 == 0) {
        uVar10 = this->m_n_points_to_draw;
        pGVar1 = &this->m_xfb_bo_id;
        (*gl->genBuffers)(1,pGVar1);
        GVar16 = (*gl->getError)();
        glu::checkError(GVar16,"glGenBuffers() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                        ,0x259d);
        (*gl->bindBuffer)(0x8c8e,*pGVar1);
        GVar16 = (*gl->getError)();
        glu::checkError(GVar16,"glBindBuffer() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                        ,0x25a0);
        (*gl->bindBufferBase)(0x8c8e,0,*pGVar1);
        GVar16 = (*gl->getError)();
        glu::checkError(GVar16,"glBindBufferBase() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                        ,0x25a3);
        (*gl->bufferData)(0x8c8e,(ulong)(uVar10 << 2),(void *)0x0,0x88e6);
        GVar16 = (*gl->getError)();
        glu::checkError(GVar16,"glBufferData() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                        ,0x25a6);
        (*gl->genVertexArrays)(1,&this->m_vao_id);
        GVar16 = (*gl->getError)();
        glu::checkError(GVar16,"glGenVertexArrays() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                        ,0x25aa);
        (*gl->bindVertexArray)(this->m_vao_id);
        GVar16 = (*gl->getError)();
        glu::checkError(GVar16,"glBindVertexArray() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                        ,0x25ad);
        std::__cxx11::string::~string((string *)&vs_body);
        return;
      }
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,
                 "glGetSubroutineUniformLocation() returned -1 for an active subroutine uniform",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                 ,0x2596);
    }
    else {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"glGetSubroutineIndex() returned GL_INVALID_INDEX for a valid subroutine",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                 ,0x2586);
    }
  }
  else {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Failed to build test program object",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
               ,0x2577);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void FunctionalTest18_19::initTest()
{
	const glw::Functions& gl		  = m_context.getRenderContext().getFunctions();
	const char*			  varyings[1] = { "result" };
	std::string			  vs_body	 = getVertexShaderBody();
	const unsigned int	n_varyings  = sizeof(varyings) / sizeof(varyings[0]);

	if (!Utils::buildProgram(gl, vs_body, "",						  /* tc_body */
							 "",									  /* te_body */
							 "",									  /* gs_body */
							 "",									  /* fs_body */
							 varyings, n_varyings, &m_vs_id, DE_NULL, /* out_tc_id */
							 DE_NULL,								  /* out_te_id */
							 DE_NULL,								  /* out_gs_id */
							 DE_NULL,								  /* out_fs_id */
							 &m_po_id))
	{
		TCU_FAIL("Failed to build test program object");
	}

	/* Retrieve subroutine & subroutine uniform locations */
	m_po_subroutine_divide_by_two_location	= gl.getSubroutineIndex(m_po_id, GL_VERTEX_SHADER, "divideByTwo");
	m_po_subroutine_multiply_by_four_location = gl.getSubroutineIndex(m_po_id, GL_VERTEX_SHADER, "multiplyByFour");
	m_po_subroutine_returns_false_location	= gl.getSubroutineIndex(m_po_id, GL_VERTEX_SHADER, "returnsFalse");
	m_po_subroutine_returns_true_location	 = gl.getSubroutineIndex(m_po_id, GL_VERTEX_SHADER, "returnsTrue");
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetSubroutineIndex() call(s) failed");

	if (m_po_subroutine_divide_by_two_location == GL_INVALID_INDEX ||
		m_po_subroutine_multiply_by_four_location == GL_INVALID_INDEX ||
		m_po_subroutine_returns_false_location == GL_INVALID_INDEX ||
		m_po_subroutine_returns_true_location == GL_INVALID_INDEX)
	{
		TCU_FAIL("glGetSubroutineIndex() returned GL_INVALID_INDEX for a valid subroutine");
	}

	m_po_subroutine_uniform_bool_operator1 =
		gl.getSubroutineUniformLocation(m_po_id, GL_VERTEX_SHADER, "bool_operator1");
	m_po_subroutine_uniform_bool_operator2 =
		gl.getSubroutineUniformLocation(m_po_id, GL_VERTEX_SHADER, "bool_operator2");
	m_po_subroutine_uniform_vec4_processor1 =
		gl.getSubroutineUniformLocation(m_po_id, GL_VERTEX_SHADER, "vec4_operator1");
	m_po_subroutine_uniform_vec4_processor2 =
		gl.getSubroutineUniformLocation(m_po_id, GL_VERTEX_SHADER, "vec4_operator2");
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetSubroutineUniformLocation() call(s) failed");

	if (m_po_subroutine_uniform_bool_operator1 == -1 || m_po_subroutine_uniform_bool_operator2 == -1 ||
		m_po_subroutine_uniform_vec4_processor1 == -1 || m_po_subroutine_uniform_vec4_processor2 == -1)
	{
		TCU_FAIL("glGetSubroutineUniformLocation() returned -1 for an active subroutine uniform");
	}

	/* Set up XFB BO */
	const unsigned int bo_size = static_cast<unsigned int>(sizeof(float) * m_n_points_to_draw);

	gl.genBuffers(1, &m_xfb_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed.");

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_xfb_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_xfb_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call failed.");

	gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, bo_size, DE_NULL /* data */, GL_STATIC_COPY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed.");

	/* Set up a VAO */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() call failed.");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() call failed.");
}